

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panel_code.cpp
# Opt level: O1

void copy_item_to_command_proc(Am_Object *panel_item,Am_Value *value)

{
  Am_Value_Type AVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *in_value;
  Am_Wrapper *value_00;
  Am_Object *this;
  Am_Object command;
  Am_Object owners_cmd;
  Am_Object owner;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  
  AVar1 = value->type;
  if (AVar1 == 0xa001) {
    Am_Object::Am_Object(&local_30,value);
    bVar2 = Am_Object::Valid(&local_30);
    if (!bVar2) goto LAB_00244665;
    Am_Object::Am_Object(&local_38,value);
    Am_Object::Am_Object(&local_40,&Am_Command);
    bVar3 = Am_Object::Is_Instance_Of(&local_38,&local_40);
    bVar2 = true;
  }
  else {
LAB_00244665:
    bVar2 = false;
    bVar3 = false;
  }
  if (bVar2) {
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_38);
  }
  if (AVar1 == 0xa001) {
    Am_Object::~Am_Object(&local_30);
  }
  if (bVar3 == false) {
    bVar2 = Am_Object::Is_Part_Slot(panel_item,0xc5);
    if (bVar2) {
      Am_Object::Remove_Part(panel_item,0xc5);
    }
    Am_Object::Set(panel_item,0xc5,value,1);
    return;
  }
  Am_Object::Am_Object(&local_70,value);
  Am_Object::Get_Object(&local_60,(Am_Slot_Key)&local_70,10);
  bVar2 = Am_Object::operator==(&local_60,panel_item);
  if (bVar2) {
    Am_Object::Get_Object(&local_68,(Am_Slot_Key)panel_item,0xc5);
    bVar2 = Am_Object::operator==(&local_68,&local_70);
    Am_Object::~Am_Object(&local_68);
    if (bVar2) goto LAB_00244863;
    Am_Object::Am_Object(&local_48,&local_70);
    Am_Object::Remove_Part(panel_item,&local_48);
    this = &local_48;
LAB_002447f1:
    Am_Object::~Am_Object(this);
  }
  else {
    bVar2 = Am_Object::Valid(&local_60);
    if (bVar2) {
      in_value = Am_Object::Get(&local_60,0xa3,7);
      Am_Object::Am_Object(&local_68,in_value);
      bVar2 = Am_Object::operator!=(&local_68,&local_70);
      if (bVar2) {
        Am_Object::Remove_From_Owner(&local_70);
      }
      else {
        Am_Object::Create(&local_50,(char *)&local_70);
        Am_Object::operator=(&local_70,&local_50);
        Am_Object::~Am_Object(&local_50);
      }
      this = &local_68;
      goto LAB_002447f1;
    }
  }
  bVar2 = Am_Object::Is_Part_Slot(panel_item,0xc5);
  if (bVar2) {
    Am_Object::Remove_Part(panel_item,0xc5);
  }
  Am_Object::Am_Object(&local_58,&local_70);
  Am_Object::Set_Part(panel_item,0xc5,&local_58,1);
  Am_Object::~Am_Object(&local_58);
  value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(panel_item,0x1c6,value_00,1);
LAB_00244863:
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_70);
  return;
}

Assistant:

void
copy_item_to_command_proc(Am_Object &panel_item, const Am_Value &value)
{
  if (value.type == Am_OBJECT && Am_Object(value).Valid() &&
      Am_Object(value).Is_Instance_Of(Am_Command)) {
    // then is a command
    Am_Object command = value;
    Am_Object owner = command.Get_Owner(Am_NO_DEPENDENCY);
    if (owner == panel_item) {
      if (panel_item.Get_Object(Am_COMMAND, Am_NO_DEPENDENCY) == command)
        return; // already fine
      else
        panel_item.Remove_Part(command); // part of me in the wrong slot??
    } else if (owner.Valid()) {
      Am_Object owners_cmd =
          owner.Get(Am_ITEM, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      if (owners_cmd != command) {
        //this can happen when the map re-shuffles the items due to a
        //new one being added or removed.  The map would remove command
        //from owner later.
        // std::cout << "Owner " << owner << " changing item from " << command
        //     << " to " << owners_cmd <<std::endl <<std::flush;
        command.Remove_From_Owner();
      } else // make new instance, leave command where it is
        command = command.Create();
    }
    if (panel_item.Is_Part_Slot(Am_COMMAND)) {
      // prevent deleting the prior command
      panel_item.Remove_Part(Am_COMMAND);
    }
    //Set_Part removes old value if any
    panel_item.Set_Part(Am_COMMAND, command, Am_OK_IF_NOT_THERE);
    panel_item.Set(Am_ATTACHED_COMMAND, command, Am_OK_IF_NOT_THERE);
  } else // not a command object, add to COMMAND slot as a value
  {
    if (panel_item.Is_Part_Slot(Am_COMMAND)) {
      // prevent deleting the prior command
      panel_item.Remove_Part(Am_COMMAND);
    }
    panel_item.Set(Am_COMMAND, value, Am_OK_IF_NOT_THERE);
  }
}